

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O2

int main(void)

{
  _Alloc_hider _Var1;
  int iVar2;
  ostream *poVar3;
  allocator local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  media::EasyScreenCapturer::GetInstance();
  _Var1._M_p = local_b0._M_dataplus._M_p;
  std::__cxx11::string::string((string *)&filename,"test0.bmp",(allocator *)&local_70);
  (**(code **)(*(long *)_Var1._M_p + 0x18))(_Var1._M_p,&filename);
  std::__cxx11::string::~string((string *)&filename);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b0._M_string_length);
  media::EasyScreenCapturer::GetInstance();
  _Var1._M_p = local_b0._M_dataplus._M_p;
  std::__cxx11::string::string((string *)&filename,"test1.bmp",(allocator *)&local_70);
  (**(code **)(*(long *)_Var1._M_p + 0x18))(_Var1._M_p,&filename);
  std::__cxx11::string::~string((string *)&filename);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b0._M_string_length);
  media::EasyScreenCapturer::GetInstance();
  _Var1._M_p = local_b0._M_dataplus._M_p;
  std::__cxx11::string::string((string *)&filename,"test2.bmp",(allocator *)&local_70);
  (**(code **)(*(long *)_Var1._M_p + 0x18))(_Var1._M_p,&filename);
  std::__cxx11::string::~string((string *)&filename);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b0._M_string_length);
  media::EasyScreenCapturer::GetInstance();
  _Var1._M_p = local_b0._M_dataplus._M_p;
  std::__cxx11::string::string((string *)&filename,"test_1.bmp",(allocator *)&local_70);
  iVar2 = (**(code **)(*(long *)_Var1._M_p + 0x10))(_Var1._M_p,&filename,0,0,0x556,0x300);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&filename);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b0._M_string_length);
  media::EasyScreenCapturer::GetInstance();
  _Var1._M_p = local_b0._M_dataplus._M_p;
  std::__cxx11::string::string((string *)&filename,"test_2.bmp",(allocator *)&local_70);
  iVar2 = (**(code **)(*(long *)_Var1._M_p + 0x10))(_Var1._M_p,&filename,100,100,0x4f2,0x29c);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&filename);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b0._M_string_length);
  for (iVar2 = 1; iVar2 != 0x3e9; iVar2 = iVar2 + 1) {
    std::__cxx11::string::string((string *)&local_70,"img/test_",&local_b1);
    std::__cxx11::to_string(&local_50,iVar2);
    std::operator+(&local_b0,&local_70,&local_50);
    std::operator+(&filename,&local_b0,".bmp");
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    media::EasyScreenCapturer::GetInstance();
    (**(code **)(*(long *)local_b0._M_dataplus._M_p + 0x18))(local_b0._M_dataplus._M_p,&filename);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b0._M_string_length);
    local_b0._M_dataplus._M_p = (pointer)0x32;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)&local_b0);
    std::__cxx11::string::~string((string *)&filename);
  }
  return 0;
}

Assistant:

int main() {
    media::EasyScreenCapturer::GetInstance()->CaptureFullScreenAsBmp("test0.bmp");
    media::EasyScreenCapturer::GetInstance()->CaptureFullScreenAsBmp("test1.bmp");
    media::EasyScreenCapturer::GetInstance()->CaptureFullScreenAsBmp("test2.bmp");
    std::cout << media::EasyScreenCapturer::GetInstance()->CaptureScreenAsBmp("test_1.bmp", 0, 0, 1366, 768) << std::endl;
    std::cout << media::EasyScreenCapturer::GetInstance()->CaptureScreenAsBmp("test_2.bmp", 100, 100, 1266, 668) << std::endl;
    int i = 0;
    while (i++ < 1000) {
        std::string filename = std::string("img/test_") + std::to_string(i) + ".bmp";
        media::EasyScreenCapturer::GetInstance()->CaptureFullScreenAsBmp(filename);
        std::this_thread::sleep_for(std::chrono::milliseconds(50)); //20fps
    }

    return 0;
}